

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_FlagCombinedAfterShortParam_Test::~OptionParser_FlagCombinedAfterShortParam_Test
          (OptionParser_FlagCombinedAfterShortParam_Test *this)

{
  OptionParser_FlagCombinedAfterShortParam_Test *this_local;
  
  ~OptionParser_FlagCombinedAfterShortParam_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(OptionParser, FlagCombinedAfterShortParam) {
  std::string error;
  std::string param;
  bool has_x = false;

  OptionParser parser("prog", "desc");
  parser.SetErrorCallback([&](const char* msg) { error = msg; });
  parser.AddOption('p', "p", "metavar", "help",
                   [&](const char* arg) { param = arg; });
  parser.AddOption('x', "x", "help", [&]() { has_x = true; });
  const char* args[] = {"prog name", "-px", "stuff"};
  parser.Parse(3, const_cast<char**>(args));
  EXPECT_EQ("", param);
  EXPECT_TRUE(has_x);
  EXPECT_EQ(error, "prog: unexpected argument 'stuff'" ERROR_ENDING);
}